

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_inttable_next(upb_inttable *t,uintptr_t *key,upb_value *val,intptr_t *iter)

{
  upb_value *key_00;
  upb_value *puVar1;
  size_t sVar2;
  size_t sVar3;
  upb_tabent *puVar4;
  upb_tabent *ent_1;
  size_t tab_idx;
  upb_value *ent;
  intptr_t i;
  intptr_t *iter_local;
  upb_value *val_local;
  uintptr_t *key_local;
  upb_inttable *t_local;
  
  ent = (upb_value *)*iter;
  if ((undefined1 *)(ulong)t->array_size < (undefined1 *)((long)&ent->val + 1U)) {
LAB_004c19c4:
    sVar2 = next(&t->t,(long)ent - (ulong)t->array_size);
    sVar3 = upb_table_size(&t->t);
    if (sVar2 < sVar3) {
      puVar4 = (t->t).entries + sVar2;
      *key = (uintptr_t)puVar4->key;
      val->val = (puVar4->val).val;
      *iter = sVar2 + t->array_size;
      t_local._7_1_ = true;
    }
    else {
      *iter = 0x7ffffffffffffffe;
      t_local._7_1_ = false;
    }
  }
  else {
    do {
      key_00 = (upb_value *)((long)&ent->val + 1);
      if ((upb_value *)(ulong)t->array_size <= key_00) goto LAB_004c19c4;
      puVar1 = inttable_array_get(t,(uintptr_t)key_00);
      ent = key_00;
    } while (puVar1 == (upb_value *)0x0);
    *key = (uintptr_t)key_00;
    val->val = puVar1->val;
    *iter = (intptr_t)key_00;
    t_local._7_1_ = true;
  }
  return t_local._7_1_;
}

Assistant:

bool upb_inttable_next(const upb_inttable* t, uintptr_t* key, upb_value* val,
                       intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)(i + 1) <= t->array_size) {
    while ((size_t)++i < t->array_size) {
      const upb_value* ent = inttable_array_get(t, i);
      if (ent) {
        *key = i;
        *val = *ent;
        *iter = i;
        return true;
      }
    }
    i--;  // Back up to exactly one position before the start of the table.
  }

  size_t tab_idx = next(&t->t, i - t->array_size);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = ent->key.num;
    *val = ent->val;
    *iter = tab_idx + t->array_size;
    return true;
  } else {
    // We should set the iterator any way. When we are done, the iterator value
    // is invalidated. `upb_inttable_done` will check on the iterator value to
    // determine if the iteration is done.
    *iter = INTPTR_MAX - 1;  // To disambiguate from UPB_INTTABLE_BEGIN, to
                             // match the behavior of `upb_strtable_iter`.
    return false;
  }
}